

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

QTreeWidgetItem * __thiscall QTreeWidget::itemBelow(QTreeWidget *this,QTreeWidgetItem *item)

{
  long lVar1;
  char *__s;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tVar2;
  QTreeWidgetItem *pQVar3;
  long in_FS_OFFSET;
  undefined8 local_78;
  QTreeWidgetItem *pQStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QTreeWidgetItem *local_48;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  lVar1 = QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
  if (*(QTreeWidgetItem **)(lVar1 + 0x18) == item) {
    pQVar3 = (QTreeWidgetItem *)0x0;
  }
  else {
    local_48 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    __s = (char *)QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
    QTreeModel::index((QTreeModel *)&local_58,__s,(int)item);
    local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    QTreeView::indexBelow((QModelIndex *)&local_78,&this->super_QTreeView,(QModelIndex *)&local_58);
    QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
    tVar2.ptr = local_68.ptr;
    if ((QTreeWidgetItem *)local_68.ptr != (QTreeWidgetItem *)0x0) {
      tVar2.ptr = (QAbstractItemModel *)pQStack_70;
    }
    pQVar3 = (QTreeWidgetItem *)0x0;
    if (-1 < (int)(local_78._4_4_ | (uint)local_78)) {
      pQVar3 = (QTreeWidgetItem *)tVar2.ptr;
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QTreeWidgetItem *QTreeWidget::itemBelow(const QTreeWidgetItem *item) const
{
    Q_D(const QTreeWidget);
    if (item == d->treeModel()->headerItem)
        return nullptr;
    const QModelIndex index = d->index(item);
    const QModelIndex below = indexBelow(index);
    return d->item(below);
}